

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_clock.c
# Opt level: O2

void csp_clock_get_time(csp_timestamp_t *time)

{
  int iVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  timespec ts;
  timespec local_20;
  
  iVar1 = clock_gettime(0,&local_20);
  uVar3 = 0;
  uVar2 = 0;
  if (iVar1 == 0) {
    uVar3 = (uint32_t)local_20.tv_sec;
    uVar2 = (uint32_t)local_20.tv_nsec;
  }
  time->tv_sec = uVar3;
  time->tv_nsec = uVar2;
  return;
}

Assistant:

__weak void csp_clock_get_time(csp_timestamp_t * time) {

	struct timespec ts;
	if (clock_gettime(CLOCK_REALTIME, &ts) == 0) {
		time->tv_sec = ts.tv_sec;
		time->tv_nsec = ts.tv_nsec;
	} else {
		time->tv_sec = 0;
		time->tv_nsec = 0;
	}
}